

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Compiler.cpp
# Opt level: O3

ProcessorBase * __thiscall soul::Compiler::findMainProcessor(Compiler *this,BuildSettings *settings)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_type sVar2;
  pointer pcVar3;
  Namespace *pNVar4;
  SourceCodeText *pSVar5;
  char *pcVar6;
  bool bVar7;
  pointer ppVar8;
  ProcessorBase *pPVar9;
  pointer ppVar10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R9;
  pool_ref<soul::AST::ModuleBase> *m;
  _Alloc_hider _Var11;
  ProcessorBase *pPVar12;
  vector<soul::pool_ref<soul::AST::ProcessorBase>,_std::allocator<soul::pool_ref<soul::AST::ProcessorBase>_>_>
  mainProcessors;
  pool_ptr<soul::AST::ProcessorBase> main;
  vector<soul::pool_ref<soul::AST::ProcessorBase>,_std::allocator<soul::pool_ref<soul::AST::ProcessorBase>_>_>
  local_2a8;
  CompileMessage local_288;
  string *local_250;
  string local_248;
  CompileMessage local_228;
  ArrayWithPreallocation<soul::Identifier,_8UL> local_1f0;
  undefined1 local_198 [248];
  CompileMessage local_a0;
  CompileMessage local_68;
  
  sVar2 = (settings->mainProcessor)._M_string_length;
  if (sVar2 == 0) {
    local_2a8.
    super__Vector_base<soul::pool_ref<soul::AST::ProcessorBase>,_std::allocator<soul::pool_ref<soul::AST::ProcessorBase>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_2a8.
    super__Vector_base<soul::pool_ref<soul::AST::ProcessorBase>,_std::allocator<soul::pool_ref<soul::AST::ProcessorBase>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_2a8.
    super__Vector_base<soul::pool_ref<soul::AST::ProcessorBase>,_std::allocator<soul::pool_ref<soul::AST::ProcessorBase>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pNVar4 = (this->topLevelNamespace).object;
    if (pNVar4 == (Namespace *)0x0) {
      throwInternalCompilerError("object != nullptr","operator*",0x3b);
    }
    ASTUtilities::findAllMainProcessors(&pNVar4->super_ModuleBase,&local_2a8);
    ppVar8 = local_2a8.
             super__Vector_base<soul::pool_ref<soul::AST::ProcessorBase>,_std::allocator<soul::pool_ref<soul::AST::ProcessorBase>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (8 < (ulong)((long)local_2a8.
                          super__Vector_base<soul::pool_ref<soul::AST::ProcessorBase>,_std::allocator<soul::pool_ref<soul::AST::ProcessorBase>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                   (long)local_2a8.
                         super__Vector_base<soul::pool_ref<soul::AST::ProcessorBase>,_std::allocator<soul::pool_ref<soul::AST::ProcessorBase>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)) {
      local_198._0_8_ = local_198 + 0x18;
      local_198._8_8_ = 0;
      local_198._16_8_ = 4;
      if (local_2a8.
          super__Vector_base<soul::pool_ref<soul::AST::ProcessorBase>,_std::allocator<soul::pool_ref<soul::AST::ProcessorBase>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          local_2a8.
          super__Vector_base<soul::pool_ref<soul::AST::ProcessorBase>,_std::allocator<soul::pool_ref<soul::AST::ProcessorBase>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        paVar1 = &local_288.description.field_2;
        ppVar10 = local_2a8.
                  super__Vector_base<soul::pool_ref<soul::AST::ProcessorBase>,_std::allocator<soul::pool_ref<soul::AST::ProcessorBase>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        do {
          CompileMessageHelpers::createMessage<>
                    (&local_228,syntax,error,"Multiple processors were marked as \'main\'");
          pPVar12 = ppVar10->object;
          pSVar5 = (pPVar12->super_ModuleBase).super_ASTObject.context.location.sourceCode.object;
          if (pSVar5 != (SourceCodeText *)0x0) {
            (pSVar5->super_RefCountedObject).refCount =
                 (pSVar5->super_RefCountedObject).refCount + 1;
          }
          pcVar6 = (pPVar12->super_ModuleBase).super_ASTObject.context.location.location.data;
          local_288.description._M_dataplus._M_p = (pointer)paVar1;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_288,local_228.description._M_dataplus._M_p,
                     local_228.description._M_dataplus._M_p + local_228.description._M_string_length
                    );
          local_288.type = local_228.type;
          local_288.category = none;
          local_288.location.sourceCode.object = pSVar5;
          local_288.location.location.data = pcVar6;
          ArrayWithPreallocation<soul::CompileMessage,_4UL>::push_back
                    ((ArrayWithPreallocation<soul::CompileMessage,_4UL> *)local_198,&local_288);
          RefCountedPtr<soul::SourceCodeText>::decIfNotNull(local_288.location.sourceCode.object);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_288.description._M_dataplus._M_p != paVar1) {
            operator_delete(local_288.description._M_dataplus._M_p,
                            local_288.description.field_2._M_allocated_capacity + 1);
          }
          RefCountedPtr<soul::SourceCodeText>::decIfNotNull((SourceCodeText *)0x0);
          RefCountedPtr<soul::SourceCodeText>::decIfNotNull(local_228.location.sourceCode.object);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_228.description._M_dataplus._M_p != &local_228.description.field_2) {
            operator_delete(local_228.description._M_dataplus._M_p,
                            local_228.description.field_2._M_allocated_capacity + 1);
          }
          ppVar10 = ppVar10 + 1;
        } while (ppVar10 != ppVar8);
      }
      throwError((CompileMessageGroup *)local_198);
    }
    if ((long)local_2a8.
              super__Vector_base<soul::pool_ref<soul::AST::ProcessorBase>,_std::allocator<soul::pool_ref<soul::AST::ProcessorBase>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)local_2a8.
              super__Vector_base<soul::pool_ref<soul::AST::ProcessorBase>,_std::allocator<soul::pool_ref<soul::AST::ProcessorBase>_>_>
              ._M_impl.super__Vector_impl_data._M_start == 8) {
      pPVar12 = (local_2a8.
                 super__Vector_base<soul::pool_ref<soul::AST::ProcessorBase>,_std::allocator<soul::pool_ref<soul::AST::ProcessorBase>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->object;
    }
    else {
      pNVar4 = (this->topLevelNamespace).object;
      if (pNVar4 == (Namespace *)0x0) {
        throwInternalCompilerError("object != nullptr","operator*",0x3b);
      }
      ASTUtilities::scanForProcessorToUseAsMain((ASTUtilities *)local_198,&pNVar4->super_ModuleBase)
      ;
      if ((ProcessorBase *)local_198._0_8_ == (ProcessorBase *)0x0) {
        pNVar4 = (this->topLevelNamespace).object;
        if (pNVar4 == (Namespace *)0x0) {
          throwInternalCompilerError("object != nullptr","operator->",0x3c);
        }
        CompileMessageHelpers::createMessage<>
                  (&local_a0,syntax,error,"Cannot find a main processor or graph to use");
        AST::Context::throwError
                  (&(pNVar4->super_ModuleBase).super_ASTObject.context,&local_a0,false);
      }
      pPVar12 = (ProcessorBase *)local_198._0_8_;
      if (local_2a8.
          super__Vector_base<soul::pool_ref<soul::AST::ProcessorBase>,_std::allocator<soul::pool_ref<soul::AST::ProcessorBase>_>_>
          ._M_impl.super__Vector_impl_data._M_start == (pointer)0x0) {
        return (ProcessorBase *)local_198._0_8_;
      }
    }
    operator_delete(local_2a8.
                    super__Vector_base<soul::pool_ref<soul::AST::ProcessorBase>,_std::allocator<soul::pool_ref<soul::AST::ProcessorBase>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_2a8.
                          super__Vector_base<soul::pool_ref<soul::AST::ProcessorBase>,_std::allocator<soul::pool_ref<soul::AST::ProcessorBase>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_2a8.
                          super__Vector_base<soul::pool_ref<soul::AST::ProcessorBase>,_std::allocator<soul::pool_ref<soul::AST::ProcessorBase>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
    return pPVar12;
  }
  local_250 = &settings->mainProcessor;
  pPVar12 = (ProcessorBase *)&(this->allocator).identifiers;
  pcVar3 = (local_250->_M_dataplus)._M_p;
  local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_248,pcVar3,pcVar3 + sVar2);
  IdentifierPath::fromString((IdentifierPath *)local_198,(Pool *)pPVar12,&local_248);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_248._M_dataplus._M_p != &local_248.field_2) {
    operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
  }
  if (local_198._8_8_ != 0) {
    pNVar4 = (this->topLevelNamespace).object;
    if (pNVar4 == (Namespace *)0x0) {
      throwInternalCompilerError("object != nullptr","operator->",0x3c);
    }
    ArrayWithPreallocation<soul::Identifier,_8UL>::ArrayWithPreallocation
              (&local_1f0,(ArrayWithPreallocation<soul::Identifier,_8UL> *)local_198);
    AST::Scope::getMatchingSubModules
              ((vector<soul::pool_ref<soul::AST::ModuleBase>,_std::allocator<soul::pool_ref<soul::AST::ModuleBase>_>_>
                *)&local_288,&(pNVar4->super_ModuleBase).super_Scope,(IdentifierPath *)&local_1f0);
    local_1f0.numActive = 0;
    if (8 < local_1f0.numAllocated) {
      if (local_1f0.items != (Identifier *)0x0) {
        operator_delete__(local_1f0.items);
      }
      local_1f0.items = (Identifier *)local_1f0.space;
      local_1f0.numAllocated = 8;
    }
    bVar7 = true;
    _Var11._M_p = local_288.description._M_dataplus._M_p;
    if (local_288.description._M_dataplus._M_p != (pointer)local_288.description._M_string_length) {
      do {
        if ((*(size_type *)_Var11._M_p != 0) &&
           (pPVar9 = (ProcessorBase *)
                     __dynamic_cast(*(size_type *)_Var11._M_p,&AST::ModuleBase::typeinfo,
                                    &AST::ProcessorBase::typeinfo,0), pPVar9 != (ProcessorBase *)0x0
           )) {
          bVar7 = false;
          pPVar12 = pPVar9;
          goto LAB_001c516c;
        }
        _Var11._M_p = _Var11._M_p + 8;
      } while (_Var11._M_p != (pointer)local_288.description._M_string_length);
      bVar7 = true;
    }
LAB_001c516c:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_288.description._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      operator_delete(local_288.description._M_dataplus._M_p,
                      local_288.description.field_2._M_allocated_capacity -
                      (long)local_288.description._M_dataplus._M_p);
    }
    if (!bVar7) {
      local_198._8_8_ = 0;
      if ((ulong)local_198._16_8_ < 9) {
        return pPVar12;
      }
      if ((ProcessorBase *)local_198._0_8_ == (ProcessorBase *)0x0) {
        return pPVar12;
      }
      operator_delete__((void *)local_198._0_8_);
      return pPVar12;
    }
  }
  local_288.description._M_dataplus._M_p = (pointer)0x0;
  local_288.description._M_string_length = 0;
  CompileMessageHelpers::createMessage<std::__cxx11::string_const&>
            (&local_68,(CompileMessageHelpers *)0x1,none,0x2a4451,(char *)local_250,in_R9);
  CodeLocation::throwError((CodeLocation *)&local_288,&local_68);
}

Assistant:

AST::ProcessorBase& Compiler::findMainProcessor (const BuildSettings& settings)
{
    if (! settings.mainProcessor.empty())
    {
        auto path = IdentifierPath::fromString (allocator.identifiers, settings.mainProcessor);

        if (path.isValid())
            for (auto& m : topLevelNamespace->getMatchingSubModules (path))
                if (auto pb = cast<AST::ProcessorBase> (m))
                    return *pb;

        CodeLocation().throwError (Errors::cannotFindMainProcessorWithName (settings.mainProcessor));
    }

    std::vector<pool_ref<AST::ProcessorBase>> mainProcessors;
    ASTUtilities::findAllMainProcessors (*topLevelNamespace, mainProcessors);

    if (mainProcessors.size() > 1)
    {
        CompileMessageGroup group;

        for (auto& p : mainProcessors)
            group.messages.push_back (Errors::multipleProcessorsMarkedAsMain().withLocation (p->context.location));

        throwError (group);
    }

    if (mainProcessors.size() == 1)
        return mainProcessors.front();

    auto main = ASTUtilities::scanForProcessorToUseAsMain (*topLevelNamespace);

    if (main == nullptr)
        topLevelNamespace->context.throwError (Errors::cannotFindMainProcessor());

    return *main;
}